

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O0

bool __thiscall QSqlCachedResult::fetch(QSqlCachedResult *this,int i)

{
  bool bVar1;
  int iVar2;
  QSqlResult *this_00;
  ulong uVar3;
  int in_ESI;
  long *in_RDI;
  QSqlCachedResultPrivate *d;
  undefined4 in_stack_ffffffffffffffe8;
  bool local_1;
  
  this_00 = (QSqlResult *)d_func((QSqlCachedResult *)0x11950f);
  bVar1 = QSqlResult::isActive(this_00);
  if ((bVar1) && (-1 < in_ESI)) {
    iVar2 = QSqlResult::at(this_00);
    if (iVar2 == in_ESI) {
      local_1 = true;
    }
    else if (((ulong)this_00[10].d_ptr & 0x10000) == 0) {
      bVar1 = QSqlCachedResultPrivate::canSeek((QSqlCachedResultPrivate *)this_00,in_ESI);
      if (bVar1) {
        (**(code **)(*in_RDI + 0x18))(in_RDI,in_ESI);
        local_1 = true;
      }
      else {
        if (0 < *(int *)&this_00[0xc].d_ptr) {
          iVar2 = QSqlCachedResultPrivate::cacheCount((QSqlCachedResultPrivate *)this_00);
          (**(code **)(*in_RDI + 0x18))(in_RDI,iVar2);
        }
        do {
          iVar2 = QSqlResult::at(this_00);
          if (in_ESI + 1 <= iVar2) goto LAB_001196bc;
          bVar1 = cacheNext((QSqlCachedResult *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        } while (bVar1);
        bVar1 = QSqlCachedResultPrivate::canSeek((QSqlCachedResultPrivate *)this_00,in_ESI);
        if (bVar1) {
LAB_001196bc:
          (**(code **)(*in_RDI + 0x18))(in_RDI,in_ESI);
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      iVar2 = QSqlResult::at(this_00);
      if ((in_ESI < iVar2) || (iVar2 = QSqlResult::at(this_00), iVar2 == -2)) {
        local_1 = false;
      }
      else {
        while (iVar2 = QSqlResult::at(this_00), iVar2 < in_ESI + -1) {
          uVar3 = (**(code **)(*in_RDI + 0xf8))(in_RDI,this_00 + 0xb,0xffffffff);
          if ((uVar3 & 1) == 0) {
            return false;
          }
          iVar2 = QSqlResult::at(this_00);
          (**(code **)(*in_RDI + 0x18))(in_RDI,iVar2 + 1);
        }
        uVar3 = (**(code **)(*in_RDI + 0xf8))(in_RDI,this_00 + 0xb,0);
        if ((uVar3 & 1) == 0) {
          local_1 = false;
        }
        else {
          iVar2 = QSqlResult::at(this_00);
          (**(code **)(*in_RDI + 0x18))(in_RDI,iVar2 + 1);
          local_1 = true;
        }
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QSqlCachedResult::fetch(int i)
{
    Q_D(QSqlCachedResult);
    if ((!isActive()) || (i < 0))
        return false;
    if (at() == i)
        return true;
    if (d->forwardOnly) {
        // speed hack - do not copy values if not needed
        if (at() > i || at() == QSql::AfterLastRow)
            return false;
        while(at() < i - 1) {
            if (!gotoNext(d->cache, -1))
                return false;
            setAt(at() + 1);
        }
        if (!gotoNext(d->cache, 0))
            return false;
        setAt(at() + 1);
        return true;
    }
    if (d->canSeek(i)) {
        setAt(i);
        return true;
    }
    if (d->rowCacheEnd > 0)
        setAt(d->cacheCount());
    while (at() < i + 1) {
        if (!cacheNext()) {
            if (d->canSeek(i))
                break;
            return false;
        }
    }
    setAt(i);

    return true;
}